

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage1Runner.hpp
# Opt level: O1

void __thiscall Centaurus::Stage1Runner::signal_exit(Stage1Runner *this)

{
  void *pvVar1;
  long lVar2;
  int iVar3;
  
  pvVar1 = (this->super_BaseRunner).m_sub_window;
  if (0 < (this->super_BaseRunner).m_bank_num) {
    lVar2 = 0;
    iVar3 = 0;
    do {
      do {
        iVar3 = (iVar3 + 1) - (uint)(*(int *)((long)pvVar1 + lVar2 * 8 + 4) == 0);
        lVar2 = lVar2 + 1;
      } while (lVar2 < (this->super_BaseRunner).m_bank_num);
      if (iVar3 == 0) break;
      lVar2 = 0;
      iVar3 = 0;
    } while (0 < (this->super_BaseRunner).m_bank_num);
  }
  if (0 < (this->super_BaseRunner).m_bank_num) {
    lVar2 = 0;
    do {
      LOCK();
      *(undefined4 *)((long)pvVar1 + lVar2 * 8 + 4) = 6;
      UNLOCK();
      sem_post((sem_t *)(this->super_BaseRunner).m_slave_lock);
      lVar2 = lVar2 + 1;
    } while (lVar2 < (this->super_BaseRunner).m_bank_num);
  }
  return;
}

Assistant:

void signal_exit()
  {
    WindowBankEntry *banks = (WindowBankEntry *)m_sub_window;
    while (true) {
      int count = 0;
      for (int i = 0; i < m_bank_num; i++) {
        WindowBankState state = banks[i].state.load();
        if (state != WindowBankState::Free)
          count++;
      }
      if (count == 0) break;
    }
    for (int i = 0; i < m_bank_num; i++) {
      banks[i].state.store(WindowBankState::YouAreDone);
      release_semaphore();
    }
  }